

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifySchema(Parse *pParse,int iDb)

{
  Parse *local_28;
  Parse *pToplevel;
  int iDb_local;
  Parse *pParse_local;
  
  local_28 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_28 = pParse->pToplevel;
  }
  if (((local_28->cookieMask & 1 << ((byte)iDb & 0x1f)) == 0) &&
     (local_28->cookieMask = 1 << ((byte)iDb & 0x1f) | local_28->cookieMask, iDb == 1)) {
    sqlite3OpenTempDatabase(local_28);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifySchema(Parse *pParse, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);

  assert( iDb>=0 && iDb<pParse->db->nDb );
  assert( pParse->db->aDb[iDb].pBt!=0 || iDb==1 );
  assert( iDb<SQLITE_MAX_ATTACHED+2 );
  assert( sqlite3SchemaMutexHeld(pParse->db, iDb, 0) );
  if( DbMaskTest(pToplevel->cookieMask, iDb)==0 ){
    DbMaskSet(pToplevel->cookieMask, iDb);
    if( !OMIT_TEMPDB && iDb==1 ){
      sqlite3OpenTempDatabase(pToplevel);
    }
  }
}